

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O0

compile_errcode __thiscall FunctionDefinition::Generate(FunctionDefinition *this)

{
  string *psVar1;
  compile_errcode cVar2;
  allocator local_421;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  undefined1 local_3b0 [8];
  Pcode pcode_func_bottom;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  allocator local_2d1;
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [8];
  Pcode pcode_bottom_label;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  string local_170;
  undefined1 local_150 [8];
  Pcode pcode_top_label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined4 local_88;
  int local_84;
  int local_80;
  int character_number;
  int line_number;
  SymbolName local_6c;
  undefined1 local_68 [4];
  SymbolName name;
  string bottom_label;
  string top_label;
  int local_20;
  int return_value_number;
  int state;
  int ret;
  FunctionDefinition *this_local;
  
  local_20 = 0;
  std::__cxx11::string::string((string *)(bottom_label.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  this->m_argument_number = 0;
  do {
    local_6c = SymbolQueue::GetCurrentName(handle_correct_queue);
    local_80 = SymbolQueue::GetCurrentLine(handle_correct_queue);
    local_84 = SymbolQueue::GetCurrentCharacter(handle_correct_queue);
    switch(local_20) {
    case 0:
      if (((local_6c != VOID_SYM) && (local_6c != INT_SYM)) && (local_6c != CHAR_SYM)) {
        this_local._4_4_ = -1;
        goto LAB_001d4e6a;
      }
      local_20 = 1;
      this->m_type = local_6c;
      break;
    case 1:
      if (local_6c != IDENTIFIER_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001d4e6a;
      }
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&local_a8,handle_correct_queue);
      std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::operator=
                ((string *)&current_func_name_abi_cxx11_,(string *)&this->m_identifier_name);
      local_20 = 2;
      break;
    case 2:
      if (local_6c != L_CIRCLE_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001d4e6a;
      }
      local_20 = 3;
      break;
    case 3:
      cVar2 = ArgumentList::Generate(&this->m_argument_list,&this->m_argument_number);
      if (cVar2 != 0) {
        this_local._4_4_ = -1;
        goto LAB_001d4e6a;
      }
      local_20 = 4;
      break;
    case 4:
      if (local_6c != R_CIRCLE_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001d4e6a;
      }
      local_20 = 5;
      break;
    case 5:
      if (local_6c != L_CURLY_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001d4e6a;
      }
      PcodeGenerator::GetNextLabel_abi_cxx11_
                ((string *)((long)&pcode_top_label.m_comment.field_2 + 8),pcode_generator);
      psVar1 = (string *)(pcode_top_label.m_comment.field_2._M_local_buf + 8);
      std::__cxx11::string::operator=((string *)(bottom_label.field_2._M_local_buf + 8),psVar1);
      std::__cxx11::string::~string(psVar1);
      FunctionTable::SetTermTopLabel
                (handle_func_table,&this->m_identifier_name,
                 (string *)(bottom_label.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)&local_170,(string *)(bottom_label.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"",&local_191);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b8,"",&local_1b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1e0,"#func_begin",&local_1e1);
      Pcode::Pcode((Pcode *)local_150,LABEL,&local_170,&local_190,&local_1b8,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      std::__cxx11::string::~string((string *)&local_170);
      PcodeGenerator::Insert(pcode_generator,(Pcode *)local_150);
      local_20 = 6;
      local_88 = 4;
      Pcode::~Pcode((Pcode *)local_150);
      break;
    case 6:
      cVar2 = CompoundStatement::Generate(&this->m_compound_statement);
      if (cVar2 != 0) {
        this_local._4_4_ = -1;
        goto LAB_001d4e6a;
      }
      local_20 = 7;
      break;
    case 7:
      if (local_6c != R_CURLY_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001d4e6a;
      }
      PcodeGenerator::GetNextLabel_abi_cxx11_
                ((string *)((long)&pcode_bottom_label.m_comment.field_2 + 8),pcode_generator);
      psVar1 = (string *)(pcode_bottom_label.m_comment.field_2._M_local_buf + 8);
      std::__cxx11::string::operator=((string *)local_68,psVar1);
      std::__cxx11::string::~string(psVar1);
      FunctionTable::SetTermBottomLabel
                (handle_func_table,&current_func_name_abi_cxx11_,(string *)local_68);
      std::__cxx11::string::string((string *)&local_2b0,(string *)local_68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d0,"",&local_2d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f8,"",&local_2f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_320,"#func_end",
                 (allocator *)(pcode_func_bottom.m_comment.field_2._M_local_buf + 0xf));
      Pcode::Pcode((Pcode *)local_290,LABEL,&local_2b0,&local_2d0,&local_2f8,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator
                ((allocator<char> *)(pcode_func_bottom.m_comment.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      std::__cxx11::string::~string((string *)&local_2b0);
      PcodeGenerator::Insert(pcode_generator,(Pcode *)local_290);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3d0,"",&local_3d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f8,"",&local_3f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_420,"",&local_421);
      Pcode::Pcode((Pcode *)local_3b0,FUNC_BOTTOM,&local_3d0,&local_3f8,&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      PcodeGenerator::Insert(pcode_generator,(Pcode *)local_3b0);
      local_20 = 8;
      local_88 = 4;
      Pcode::~Pcode((Pcode *)local_3b0);
      Pcode::~Pcode((Pcode *)local_290);
      break;
    case 8:
      this_local._4_4_ = 0;
LAB_001d4e6a:
      local_88 = 1;
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string((string *)(bottom_label.field_2._M_local_buf + 8));
      return this_local._4_4_;
    }
    if ((local_20 != 4) && (local_20 != 7)) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode FunctionDefinition::Generate() {
    int ret = COMPILE_OK;
    int state = 0;
    int return_value_number = 0;
    string top_label, bottom_label;
    m_argument_number = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == VOID_SYM || name == INT_SYM || name == CHAR_SYM) {
                    state = 1;
                    m_type = name;
                    if (name == INT_SYM || name == CHAR_SYM) {
                        return_value_number = 1;
                    } else {
                        return_value_number = 0;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    current_func_name = m_identifier_name;
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if ((ret = m_argument_list.Generate(m_argument_number)) == COMPILE_OK) {
                    state = 4;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == L_CURLY_BRACKET_SYM) {
                    top_label = pcode_generator->GetNextLabel();
                    handle_func_table->SetTermTopLabel(m_identifier_name, top_label);
                    Pcode pcode_top_label(LABEL, top_label, EMPTY_STR, EMPTY_STR, "#func_begin");
                    pcode_generator->Insert(pcode_top_label);
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 6: {
                if ((ret = m_compound_statement.Generate()) == COMPILE_OK) {
                    state = 7;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 7: {
                if (name == R_CURLY_BRACKET_SYM) {
                    bottom_label = pcode_generator->GetNextLabel();
                    handle_func_table->SetTermBottomLabel(current_func_name, bottom_label);
                    Pcode pcode_bottom_label(LABEL, bottom_label, EMPTY_STR, EMPTY_STR, "#func_end");
                    pcode_generator->Insert(pcode_bottom_label);
                    Pcode pcode_func_bottom(FUNC_BOTTOM, EMPTY_STR, EMPTY_STR, EMPTY_STR);
                    pcode_generator->Insert(pcode_func_bottom);
                    state = 8;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 8: return COMPILE_OK;
        }
        if (state != 4 && state != 7)
            handle_correct_queue->NextSymbol();
    }
}